

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O1

int helics::getFlagIndex(string *val)

{
  undefined8 in_RAX;
  const_iterator pvVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  pvVar1 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::
           find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                     ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       *)flagStringsTranslations,val,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      (flagStringsTranslations + 0x1128),
                      (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      flagStringsTranslations);
  if (pvVar1 == (const_iterator)(flagStringsTranslations + 0x920)) {
    gmlc::utilities::makeLowerCase((string *)val);
    pvVar1 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::
             find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         *)flagStringsTranslations,val,
                        (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        (flagStringsTranslations + 0x1128),
                        (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        flagStringsTranslations);
    if (pvVar1 == (const_iterator)(flagStringsTranslations + 0x920)) {
      _Var2._M_current = (val->_M_dataplus)._M_p;
      uStack_18 = CONCAT17(0x5f,(undefined7)uStack_18);
      _Var2 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var2,_Var2._M_current + val->_M_string_length,
                         (char *)((long)&uStack_18 + 7));
      val->_M_string_length = (long)_Var2._M_current - (long)(val->_M_dataplus)._M_p;
      *_Var2._M_current = '\0';
      pvVar1 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::
               find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                           *)flagStringsTranslations,val,
                          (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          (flagStringsTranslations + 0x1128),
                          (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          flagStringsTranslations);
      if (pvVar1 == (const_iterator)(flagStringsTranslations + 0x920)) {
        return -0x65;
      }
    }
  }
  return pvVar1->second;
}

Assistant:

int getFlagIndex(std::string val)
{
    const auto* fnd = flagStringsTranslations.find(val);
    if (fnd != flagStringsTranslations.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd = flagStringsTranslations.find(val);
    if (fnd != flagStringsTranslations.end()) {
        return fnd->second;
    }
    val.erase(std::remove(val.begin(), val.end(), '_'), val.end());
    fnd = flagStringsTranslations.find(val);
    if (fnd != flagStringsTranslations.end()) {
        return fnd->second;
    }
    return HELICS_INVALID_OPTION_INDEX;
}